

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tableview.cpp
# Opt level: O0

int __thiscall
QtMWidgets::TableViewSectionPrivate::init(TableViewSectionPrivate *this,EVP_PKEY_CTX *ctx)

{
  TableViewSection *pTVar1;
  QWidget *pQVar2;
  int iVar3;
  QVBoxLayout *this_00;
  TextLabel *pTVar4;
  QFont *pQVar5;
  QFlags<Qt::AlignmentFlag> local_50;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_4c;
  int local_48;
  int local_44;
  QFont local_40 [8];
  QFont font;
  WindowFlags local_30;
  QFlags<Qt::AlignmentFlag> local_2c;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_28;
  WindowFlags local_24;
  anon_union_4_2_313b0b05_for_QSizePolicy_1 local_20 [2];
  QSizePolicy sp;
  TableViewSectionPrivate *this_local;
  
  QWidget::setSizePolicy(&this->q->super_QWidget,Minimum,Fixed);
  QWidget::setBackgroundRole((ColorRole)this->q);
  QWidget::setAutoFillBackground(SUB81(this->q,0));
  this_00 = (QVBoxLayout *)operator_new(0x20);
  QVBoxLayout::QVBoxLayout(this_00,&this->q->super_QWidget);
  this->layout = this_00;
  (**(code **)(*(long *)this->layout + 0x68))();
  QLayout::setContentsMargins((int)this->layout,0,0,0);
  QSizePolicy::QSizePolicy((QSizePolicy *)&local_20[0].bits,Minimum,Fixed,DefaultType);
  QSizePolicy::setHeightForWidth((QSizePolicy *)&local_20[0].bits,true);
  pTVar4 = (TextLabel *)operator_new(0x30);
  pTVar1 = this->q;
  QFlags<Qt::WindowType>::QFlags(&local_24);
  TextLabel::TextLabel(pTVar4,&pTVar1->super_QWidget,local_24);
  this->header = pTVar4;
  QWidget::setBackgroundRole((ColorRole)this->header);
  QWidget::setAutoFillBackground(SUB81(this->header,0));
  TextLabel::setMargin(this->header,0xb);
  local_28 = local_20[0];
  QWidget::setSizePolicy((QSizePolicy *)this->header);
  pTVar4 = this->header;
  pQVar2 = (QWidget *)this->layout;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_2c);
  QBoxLayout::addWidget(pQVar2,(int)pTVar4,(QFlags_conflict1 *)0x0);
  pTVar4 = (TextLabel *)operator_new(0x30);
  pTVar1 = this->q;
  QFlags<Qt::WindowType>::QFlags(&local_30);
  TextLabel::TextLabel(pTVar4,&pTVar1->super_QWidget,local_30);
  this->footer = pTVar4;
  pQVar5 = QWidget::font((QWidget *)this->footer);
  QFont::QFont(local_40,pQVar5);
  local_44 = QFont::pointSize();
  local_44 = local_44 + -1;
  local_48 = 5;
  qMax<int>(&local_44,&local_48);
  QFont::setPointSize((int)local_40);
  TextLabel::setFont(this->footer,local_40);
  QWidget::setBackgroundRole((ColorRole)this->footer);
  QWidget::setAutoFillBackground(SUB81(this->footer,0));
  TextLabel::setMargin(this->footer,0xb);
  local_4c = local_20[0];
  QWidget::setSizePolicy((QSizePolicy *)this->footer);
  pTVar4 = this->footer;
  pQVar2 = (QWidget *)this->layout;
  QFlags<Qt::AlignmentFlag>::QFlags(&local_50);
  QBoxLayout::addWidget(pQVar2,(int)pTVar4,(QFlags_conflict1 *)0x0);
  iVar3 = QFont::~QFont(local_40);
  return iVar3;
}

Assistant:

void
TableViewSectionPrivate::init()
{
	q->setSizePolicy( QSizePolicy::Minimum, QSizePolicy::Fixed );
	q->setBackgroundRole( QPalette::Base );
	q->setAutoFillBackground( true );

	layout = new QVBoxLayout( q );
	layout->setSpacing( 0 );
	layout->setContentsMargins( 0, 0, 0, 0 );

	QSizePolicy sp( QSizePolicy::Minimum, QSizePolicy::Fixed );
	sp.setHeightForWidth( true );

	header = new TextLabel( q );
	header->setBackgroundRole( QPalette::Midlight );
	header->setAutoFillBackground( true );
	header->setMargin( 11 );
	header->setSizePolicy( sp );
	layout->addWidget( header );

	footer = new TextLabel( q );
	QFont font = footer->font();
	font.setPointSize( qMax( font.pointSize() - 1, 5 ) );
	footer->setFont( font );
	footer->setBackgroundRole( QPalette::Midlight );
	footer->setAutoFillBackground( true );
	footer->setMargin( 11 );
	footer->setSizePolicy( sp );
	layout->addWidget( footer );
}